

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_ray_hit_info * rf_collision_ray_model(rf_ray ray,rf_model model)

{
  int iVar1;
  long lVar2;
  rf_vec3 v;
  rf_ray ray_00;
  rf_mat mat;
  rf_mat mat_00;
  rf_mat mat_01;
  rf_ray rVar3;
  undefined8 *puVar4;
  rf_ray_hit_info *in_RDI;
  rf_vec3 rVar5;
  rf_vec3 rVar6;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined1 local_108 [8];
  rf_ray_hit_info tri_hit_info;
  rf_vec3 *vertdata;
  rf_vec3 c;
  undefined4 uStack_3c;
  rf_vec3 b;
  undefined4 uStack_2c;
  rf_vec3 a;
  rf_int i;
  long lStack_10;
  int triangle_count;
  rf_int m;
  
  rVar3 = ray;
  memset(in_RDI,0,0x20);
  for (lStack_10 = 0; lStack_10 < (long)model.transform._56_8_; lStack_10 = lStack_10 + 1) {
    if (*(long *)(model.mesh_count + lStack_10 * 0x70 + 8) != 0) {
      iVar1 = *(int *)(model.mesh_count + lStack_10 * 0x70);
      for (stack0xffffffffffffffe0 = 0; stack0xffffffffffffffe0 < iVar1 / 3;
          register0x00000000 = stack0xffffffffffffffe0 + 1) {
        lVar2 = *(long *)(model.mesh_count + lStack_10 * 0x70 + 8);
        if (*(long *)(model.mesh_count + lStack_10 * 0x70 + 0x38) == 0) {
          puVar4 = (undefined8 *)(lVar2 + stack0xffffffffffffffe0 * 0x24);
          unique0x00012000 = *puVar4;
          a.x = *(float *)(puVar4 + 1);
          puVar4 = (undefined8 *)(lVar2 + (stack0xffffffffffffffe0 * 3 + 1) * 0xc);
          unique0x00012000 = *puVar4;
          b.x = *(float *)(puVar4 + 1);
          puVar4 = (undefined8 *)(lVar2 + (stack0xffffffffffffffe0 * 3 + 2) * 0xc);
          vertdata = (rf_vec3 *)*puVar4;
          c.x = *(float *)(puVar4 + 1);
        }
        else {
          puVar4 = (undefined8 *)
                   (lVar2 + (ulong)*(ushort *)
                                    (*(long *)(model.mesh_count + lStack_10 * 0x70 + 0x38) +
                                    stack0xffffffffffffffe0 * 6) * 0xc);
          unique0x00012000 = *puVar4;
          a.x = *(float *)(puVar4 + 1);
          puVar4 = (undefined8 *)
                   (lVar2 + (ulong)*(ushort *)
                                    (*(long *)(model.mesh_count + lStack_10 * 0x70 + 0x38) + 2 +
                                    stack0xffffffffffffffe0 * 6) * 0xc);
          unique0x00012000 = *puVar4;
          b.x = *(float *)(puVar4 + 1);
          puVar4 = (undefined8 *)
                   (lVar2 + (ulong)*(ushort *)
                                    (*(long *)(model.mesh_count + lStack_10 * 0x70 + 0x38) + 4 +
                                    stack0xffffffffffffffe0 * 6) * 0xc);
          vertdata = (rf_vec3 *)*puVar4;
          c.x = *(float *)(puVar4 + 1);
        }
        rVar5.z = a.x;
        rVar5.x = b.z;
        rVar5.y = (float)uStack_2c;
        mat.m8 = model.transform.m0;
        mat.m12 = model.transform.m4;
        mat.m0 = ray.direction.y;
        mat.m4 = ray.direction.z;
        mat.m1 = model.transform.m8;
        mat.m5 = model.transform.m12;
        mat.m9 = model.transform.m1;
        mat.m13 = model.transform.m5;
        mat.m2 = model.transform.m9;
        mat.m6 = model.transform.m13;
        mat.m10 = model.transform.m2;
        mat.m14 = model.transform.m6;
        mat.m3 = model.transform.m10;
        mat.m7 = model.transform.m14;
        mat.m11 = model.transform.m3;
        mat.m15 = model.transform.m7;
        rVar5 = rf_vec3_transform(rVar5,mat);
        rVar6.z = b.x;
        rVar6.x = c.z;
        rVar6.y = (float)uStack_3c;
        mat_00.m8 = model.transform.m0;
        mat_00.m12 = model.transform.m4;
        mat_00.m0 = ray.direction.y;
        mat_00.m4 = ray.direction.z;
        mat_00.m1 = model.transform.m8;
        mat_00.m5 = model.transform.m12;
        mat_00.m9 = model.transform.m1;
        mat_00.m13 = model.transform.m5;
        mat_00.m2 = model.transform.m9;
        mat_00.m6 = model.transform.m13;
        mat_00.m10 = model.transform.m2;
        mat_00.m14 = model.transform.m6;
        mat_00.m3 = model.transform.m10;
        mat_00.m7 = model.transform.m14;
        mat_00.m11 = model.transform.m3;
        mat_00.m15 = model.transform.m7;
        rVar6 = rf_vec3_transform(rVar6,mat_00);
        v.z = c.x;
        v._0_8_ = vertdata;
        mat_01.m8 = model.transform.m0;
        mat_01.m12 = model.transform.m4;
        mat_01.m0 = ray.direction.y;
        mat_01.m4 = ray.direction.z;
        mat_01.m1 = model.transform.m8;
        mat_01.m5 = model.transform.m12;
        mat_01.m9 = model.transform.m1;
        mat_01.m13 = model.transform.m5;
        mat_01.m2 = model.transform.m9;
        mat_01.m6 = model.transform.m13;
        mat_01.m10 = model.transform.m2;
        mat_01.m14 = model.transform.m6;
        mat_01.m3 = model.transform.m10;
        mat_01.m7 = model.transform.m14;
        mat_01.m11 = model.transform.m3;
        mat_01.m15 = model.transform.m7;
        join_0x00001240_0x00001200_ = rf_vec3_transform(v,mat_01);
        unique0x10000ca7 = rVar3;
        ray_00.position.x = (float)uStack0000000000000008;
        ray_00.position.y = (float)uStack000000000000000c;
        ray_00.direction.y = ray.position.z;
        ray_00.direction.z = ray.direction.x;
        rf_collision_ray_triangle
                  ((rf_ray_hit_info *)local_108,ray_00,rVar5,rVar6,join_0x00001240_0x00001200_);
        if (((local_108._0_4_ & 1) != 0) &&
           (((in_RDI->hit & 1U) == 0 || ((float)local_108._4_4_ < in_RDI->distance)))) {
          in_RDI->hit = (_Bool)(char)local_108._0_4_;
          *(int3 *)&in_RDI->field_0x1 = SUB43(local_108._0_4_,1);
          in_RDI->distance = (float)local_108._4_4_;
          *(undefined8 *)&in_RDI->position = tri_hit_info._0_8_;
          *(undefined8 *)&(in_RDI->position).z = tri_hit_info.position._0_8_;
          (in_RDI->normal).y = tri_hit_info.position.z;
          (in_RDI->normal).z = tri_hit_info.normal.x;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_model(rf_ray ray, rf_model model)
{
    rf_ray_hit_info result = {0};

    for (rf_int m = 0; m < model.mesh_count; m++)
    {
// Check if meshhas vertex data on CPU for testing
        if (model.meshes[m].vertices != NULL)
        {
// model->mesh.triangle_count may not be set, vertex_count is more reliable
            int triangle_count = model.meshes[m].vertex_count / 3;

// Test against all triangles in mesh
            for (rf_int i = 0; i < triangle_count; i++)
            {
                rf_vec3 a, b, c;
                rf_vec3 *vertdata = (rf_vec3 *) model.meshes[m].vertices;

                if (model.meshes[m].indices)
                {
                    a = vertdata[model.meshes[m].indices[i * 3 + 0]];
                    b = vertdata[model.meshes[m].indices[i * 3 + 1]];
                    c = vertdata[model.meshes[m].indices[i * 3 + 2]];
                } else
                {
                    a = vertdata[i * 3 + 0];
                    b = vertdata[i * 3 + 1];
                    c = vertdata[i * 3 + 2];
                }

                a = rf_vec3_transform(a, model.transform);
                b = rf_vec3_transform(b, model.transform);
                c = rf_vec3_transform(c, model.transform);

                rf_ray_hit_info tri_hit_info = rf_collision_ray_triangle(ray, a, b, c);

                if (tri_hit_info.hit)
                {
// Save the closest hit triangle
                    if ((!result.hit) || (result.distance > tri_hit_info.distance)) result = tri_hit_info;
                }
            }
        }
    }

    return result;
}